

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

Result __thiscall wabt::interp::Table::Fill(Table *this,Store *store,u32 offset,Ref ref,u32 size)

{
  int iVar1;
  Object *pOVar2;
  pointer pRVar3;
  Enum EVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  pOVar2 = (store->objects_).list_.
           super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
           _M_impl.super__Vector_impl_data._M_start[ref.index];
  if (((pOVar2 != (Object *)0x0) && (((ulong)pOVar2 & 1) == 0)) &&
     ((iVar1 = *(int *)&(this->type_).super_ExternType.field_0xc, ref.index == 0 || iVar1 == -0x11
      || ((iVar1 == -0x10 && ((pOVar2->kind_ & ~Foreign) == DefinedFunc)))))) {
    pRVar3 = (this->elements_).
             super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (long)(this->elements_).
                  super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pRVar3 >> 3;
    uVar6 = (ulong)size;
    EVar4 = Error;
    if ((ulong)offset <= uVar5 - uVar6 && uVar6 <= uVar5) {
      if (size == 0) {
        EVar4 = Ok;
      }
      else {
        EVar4 = Ok;
        lVar7 = 0;
        do {
          *(size_t *)((long)&pRVar3[offset].index + lVar7) = ref.index;
          lVar7 = lVar7 + 8;
        } while (uVar6 << 3 != lVar7);
      }
    }
    return (Result)EVar4;
  }
  __assert_fail("store.HasValueType(ref, type_.element)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/interp.cc"
                ,0x206,"Result wabt::interp::Table::Fill(Store &, u32, Ref, u32)");
}

Assistant:

Result Table::Fill(Store& store, u32 offset, Ref ref, u32 size) {
  assert(store.HasValueType(ref, type_.element));
  if (IsValidRange(offset, size)) {
    std::fill(elements_.begin() + offset, elements_.begin() + offset + size,
              ref);
    return Result::Ok;
  }
  return Result::Error;
}